

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.hpp
# Opt level: O2

void __thiscall
Excel::Book::onCell(Book *this,size_t sheetIdx,size_t row,size_t column,wstring *value)

{
  Sheet *this_00;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> bStack_48;
  
  this_00 = sheet(this,sheetIdx);
  std::__cxx11::wstring::wstring((wstring *)&bStack_48,(wstring *)value);
  Sheet::setCell<std::__cxx11::wstring>(this_00,row,column,&bStack_48);
  std::__cxx11::wstring::~wstring((wstring *)&bStack_48);
  return;
}

Assistant:

inline void
Book::onCell( size_t sheetIdx, size_t row, size_t column, const std::wstring & value )
{
	sheet( sheetIdx )->setCell( row, column, value );
}